

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

int64 __thiscall
google::protobuf::io::CodedInputStream::ReadVarint32Fallback
          (CodedInputStream *this,uint32 first_byte_or_zero)

{
  long lVar1;
  uint8 *puVar2;
  ulong uVar3;
  uint8 *puVar4;
  uint uVar5;
  long lVar6;
  pair<unsigned_long,_bool> pVar7;
  
  puVar2 = this->buffer_;
  puVar4 = this->buffer_end_;
  if (((int)puVar4 - (int)puVar2 < 10) && ((puVar4 <= puVar2 || ((char)puVar4[-1] < '\0')))) {
    pVar7 = ReadVarint64Fallback(this);
    uVar3 = 0xffffffffffffffff;
    if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar3 = (ulong)(uint)pVar7.first;
    }
  }
  else {
    uVar5 = ((uint)puVar2[1] * 0x80 + first_byte_or_zero) - 0x80;
    if ((char)puVar2[1] < '\0') {
      uVar5 = (uVar5 + (uint)puVar2[2] * 0x4000) - 0x4000;
      if ((char)puVar2[2] < '\0') {
        uVar5 = (uVar5 + (uint)puVar2[3] * 0x200000) - 0x200000;
        if ((char)puVar2[3] < '\0') {
          puVar4 = puVar2 + 5;
          uVar5 = uVar5 + (uint)puVar2[4] * 0x10000000 + 0xf0000000;
          if ((char)puVar2[4] < '\0') {
            lVar6 = 0;
            do {
              if ((int)lVar6 == 5) {
                return -1;
              }
              lVar1 = lVar6 + 1;
              puVar2 = puVar4 + lVar6;
              lVar6 = lVar1;
            } while ((char)*puVar2 < '\0');
            puVar4 = puVar4 + lVar1;
          }
        }
        else {
          puVar4 = puVar2 + 4;
        }
      }
      else {
        puVar4 = puVar2 + 3;
      }
    }
    else {
      puVar4 = puVar2 + 2;
    }
    this->buffer_ = puVar4;
    uVar3 = (ulong)uVar5;
  }
  return uVar3;
}

Assistant:

int64 CodedInputStream::ReadVarint32Fallback(uint32 first_byte_or_zero) {
  if (BufferSize() >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buffer_end_ > buffer_ && !(buffer_end_[-1] & 0x80))) {
    GOOGLE_DCHECK_NE(first_byte_or_zero, 0)
        << "Caller should provide us with *buffer_ when buffer is non-empty";
    uint32 temp;
    ::std::pair<bool, const uint8*> p =
        ReadVarint32FromArray(first_byte_or_zero, buffer_, &temp);
    if (!p.first) return -1;
    buffer_ = p.second;
    return temp;
  } else {
    // Really slow case: we will incur the cost of an extra function call here,
    // but moving this out of line reduces the size of this function, which
    // improves the common case. In micro benchmarks, this is worth about 10-15%
    uint32 temp;
    return ReadVarint32Slow(&temp) ? static_cast<int64>(temp) : -1;
  }
}